

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void updateVirtualTable(Parse *pParse,SrcList *pSrc,Table *pTab,ExprList *pChanges,Expr *pRowid,
                       int *aXRef,Expr *pWhere,int onError)

{
  int p1;
  int iVar1;
  Vdbe *p;
  sqlite3 *db_00;
  int p3;
  int addr_00;
  Expr *pEVar2;
  Select *p_00;
  u8 local_ac;
  undefined1 local_88 [8];
  SelectDest dest;
  char *pVTab;
  sqlite3 *db;
  int iReg;
  int addr;
  int i;
  int ephemTab;
  Expr *pExpr;
  Select *pSelect;
  ExprList *pEList;
  Vdbe *v;
  int *aXRef_local;
  Expr *pRowid_local;
  ExprList *pChanges_local;
  Table *pTab_local;
  SrcList *pSrc_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  db_00 = pParse->db;
  dest._8_8_ = sqlite3GetVTable(db_00,pTab);
  pEVar2 = sqlite3Expr(db_00,0x1a,"_rowid_");
  pSelect = (Select *)sqlite3ExprListAppend(pParse,(ExprList *)0x0,pEVar2);
  if (pRowid != (Expr *)0x0) {
    pEVar2 = sqlite3ExprDup(db_00,pRowid,0);
    pSelect = (Select *)sqlite3ExprListAppend(pParse,(ExprList *)pSelect,pEVar2);
  }
  for (iReg = 0; iReg < pTab->nCol; iReg = iReg + 1) {
    if (aXRef[iReg] < 0) {
      _i = sqlite3Expr(db_00,0x1a,pTab->aCol[iReg].zName);
    }
    else {
      _i = sqlite3ExprDup(db_00,pChanges->a[aXRef[iReg]].pExpr,0);
    }
    pSelect = (Select *)sqlite3ExprListAppend(pParse,(ExprList *)pSelect,_i);
  }
  p_00 = sqlite3SelectNew(pParse,(ExprList *)pSelect,pSrc,pWhere,(ExprList *)0x0,(Expr *)0x0,
                          (ExprList *)0x0,0,(Expr *)0x0,(Expr *)0x0);
  p1 = pParse->nTab;
  pParse->nTab = p1 + 1;
  sqlite3VdbeAddOp2(p,0x2a,p1,pTab->nCol + 1 + (uint)(pRowid != (Expr *)0x0));
  sqlite3VdbeChangeP5(p,'\b');
  sqlite3SelectDestInit((SelectDest *)local_88,8,p1);
  sqlite3Select(pParse,p_00,(SelectDest *)local_88);
  iVar1 = pParse->nMem;
  p3 = iVar1 + 1;
  pParse->nMem = p3;
  pParse->nMem = pTab->nCol + 1 + pParse->nMem;
  addr_00 = sqlite3VdbeAddOp2(p,0x48,p1,0);
  sqlite3VdbeAddOp3(p,0x1d,p1,0,p3);
  sqlite3VdbeAddOp3(p,0x1d,p1,(uint)(pRowid != (Expr *)0x0),iVar1 + 2);
  for (iReg = 0; iReg < pTab->nCol; iReg = iReg + 1) {
    sqlite3VdbeAddOp3(p,0x1d,p1,iReg + 1 + (uint)(pRowid != (Expr *)0x0),iVar1 + 3 + iReg);
  }
  sqlite3VtabMakeWritable(pParse,pTab);
  sqlite3VdbeAddOp4(p,0x8c,0,pTab->nCol + 2,p3,(char *)dest._8_8_,-10);
  if (onError == 99) {
    local_ac = '\x02';
  }
  else {
    local_ac = (u8)onError;
  }
  sqlite3VdbeChangeP5(p,local_ac);
  sqlite3MayAbort(pParse);
  sqlite3VdbeAddOp2(p,0x5f,p1,addr_00 + 1);
  sqlite3VdbeJumpHere(p,addr_00);
  sqlite3VdbeAddOp2(p,0x2d,p1,0);
  sqlite3SelectDelete(db_00,p_00);
  return;
}

Assistant:

static void updateVirtualTable(
  Parse *pParse,       /* The parsing context */
  SrcList *pSrc,       /* The virtual table to be modified */
  Table *pTab,         /* The virtual table */
  ExprList *pChanges,  /* The columns to change in the UPDATE statement */
  Expr *pRowid,        /* Expression used to recompute the rowid */
  int *aXRef,          /* Mapping from columns of pTab to entries in pChanges */
  Expr *pWhere,        /* WHERE clause of the UPDATE statement */
  int onError          /* ON CONFLICT strategy */
){
  Vdbe *v = pParse->pVdbe;  /* Virtual machine under construction */
  ExprList *pEList = 0;     /* The result set of the SELECT statement */
  Select *pSelect = 0;      /* The SELECT statement */
  Expr *pExpr;              /* Temporary expression */
  int ephemTab;             /* Table holding the result of the SELECT */
  int i;                    /* Loop counter */
  int addr;                 /* Address of top of loop */
  int iReg;                 /* First register in set passed to OP_VUpdate */
  sqlite3 *db = pParse->db; /* Database connection */
  const char *pVTab = (const char*)sqlite3GetVTable(db, pTab);
  SelectDest dest;

  /* Construct the SELECT statement that will find the new values for
  ** all updated rows. 
  */
  pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(db, TK_ID, "_rowid_"));
  if( pRowid ){
    pEList = sqlite3ExprListAppend(pParse, pEList,
                                   sqlite3ExprDup(db, pRowid, 0));
  }
  assert( pTab->iPKey<0 );
  for(i=0; i<pTab->nCol; i++){
    if( aXRef[i]>=0 ){
      pExpr = sqlite3ExprDup(db, pChanges->a[aXRef[i]].pExpr, 0);
    }else{
      pExpr = sqlite3Expr(db, TK_ID, pTab->aCol[i].zName);
    }
    pEList = sqlite3ExprListAppend(pParse, pEList, pExpr);
  }
  pSelect = sqlite3SelectNew(pParse, pEList, pSrc, pWhere, 0, 0, 0, 0, 0, 0);
  
  /* Create the ephemeral table into which the update results will
  ** be stored.
  */
  assert( v );
  ephemTab = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenEphemeral, ephemTab, pTab->nCol+1+(pRowid!=0));
  sqlite3VdbeChangeP5(v, BTREE_UNORDERED);

  /* fill the ephemeral table 
  */
  sqlite3SelectDestInit(&dest, SRT_Table, ephemTab);
  sqlite3Select(pParse, pSelect, &dest);

  /* Generate code to scan the ephemeral table and call VUpdate. */
  iReg = ++pParse->nMem;
  pParse->nMem += pTab->nCol+1;
  addr = sqlite3VdbeAddOp2(v, OP_Rewind, ephemTab, 0);
  sqlite3VdbeAddOp3(v, OP_Column,  ephemTab, 0, iReg);
  sqlite3VdbeAddOp3(v, OP_Column, ephemTab, (pRowid?1:0), iReg+1);
  for(i=0; i<pTab->nCol; i++){
    sqlite3VdbeAddOp3(v, OP_Column, ephemTab, i+1+(pRowid!=0), iReg+2+i);
  }
  sqlite3VtabMakeWritable(pParse, pTab);
  sqlite3VdbeAddOp4(v, OP_VUpdate, 0, pTab->nCol+2, iReg, pVTab, P4_VTAB);
  sqlite3VdbeChangeP5(v, onError==OE_Default ? OE_Abort : onError);
  sqlite3MayAbort(pParse);
  sqlite3VdbeAddOp2(v, OP_Next, ephemTab, addr+1);
  sqlite3VdbeJumpHere(v, addr);
  sqlite3VdbeAddOp2(v, OP_Close, ephemTab, 0);

  /* Cleanup */
  sqlite3SelectDelete(db, pSelect);  
}